

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onehot.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  ostream *poVar6;
  string *this;
  int iVar7;
  char *__s;
  int vector_length;
  int index;
  vector<double,_std::allocator<double>_> onehot_vector;
  ostringstream error_message_4;
  ifstream ifs;
  int local_3f0;
  int local_3ec;
  string local_3e8;
  vector<double,_std::allocator<double>_> local_3c8;
  string local_3b0 [3];
  ios_base local_340 [264];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_3f0 = 10;
  iVar7 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"l:m:h",(option *)0x0,(int *)0x0);
    if (iVar4 < 0x6c) {
      if (iVar4 == -1) {
        iVar4 = 2;
      }
      else if (iVar4 == 0x68) {
        anon_unknown.dwarf_2ba7::PrintUsage((ostream *)&std::cout);
        iVar7 = 0;
        iVar4 = 1;
      }
      else {
LAB_001027c3:
        anon_unknown.dwarf_2ba7::PrintUsage((ostream *)&std::cerr);
LAB_001028d4:
        iVar4 = 1;
        iVar7 = 1;
      }
    }
    else if (iVar4 == 0x6d) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar2 = sptk::ConvertStringToInteger(&local_238,&local_3f0);
      bVar1 = local_3f0 < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      if (!bVar2 || bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"non-negative integer",0x14);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"onehot","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
LAB_001028a9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
          operator_delete(local_3b0[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        goto LAB_001028d4;
      }
      local_3f0 = local_3f0 + 1;
      iVar4 = 0;
    }
    else {
      if (iVar4 != 0x6c) goto LAB_001027c3;
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3b0);
      bVar1 = sptk::ConvertStringToInteger(&local_238,&local_3f0);
      bVar2 = local_3f0 < 1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      iVar4 = 0;
      if (!bVar1 || bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"The argument for the -l option must be a positive integer"
                   ,0x39);
        local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"onehot","");
        sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
        goto LAB_001028a9;
      }
    }
  } while (iVar4 == 0);
  if (iVar4 != 2) {
    return iVar7;
  }
  if (argc - ya_optind < 2) {
    if (argc == ya_optind) {
      __s = (char *)0x0;
    }
    else {
      __s = argv[ya_optind];
    }
    bVar2 = sptk::SetBinaryMode();
    this = &local_238;
    if (bVar2) {
      std::ifstream::ifstream(this);
      if ((__s == (char *)0x0) ||
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) == 0)) {
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          this = (string *)&std::cin;
        }
        local_3b0[0]._M_dataplus._M_p = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_3c8,(long)local_3f0,(value_type_conflict *)local_3b0,
                   (allocator_type *)&local_3e8);
        iVar7 = 0;
        while (bVar2 = sptk::ReadStream<int>(&local_3ec,(istream *)this), bVar2) {
          if (((long)local_3ec < 0) || (local_3f0 <= local_3ec)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)local_3b0,iVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6,"th sample is out of range",0x19);
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"onehot","");
            sptk::PrintErrorMessage(&local_3e8,(ostringstream *)local_3b0);
LAB_00102c46:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
              operator_delete(local_3e8._M_dataplus._M_p);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
            std::ios_base::~ios_base(local_340);
            iVar7 = 1;
            goto LAB_00102c79;
          }
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_3ec] = 1.0;
          bVar2 = sptk::WriteStream<double>(0,local_3f0,&local_3c8,(ostream *)&std::cout,(int *)0x0)
          ;
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_3b0,"Failed to write one-hot vector",0x1e);
            local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"onehot","");
            sptk::PrintErrorMessage(&local_3e8,(ostringstream *)local_3b0);
            goto LAB_00102c46;
          }
          local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[local_3ec] = 0.0;
          iVar7 = iVar7 + 1;
        }
        iVar7 = 0;
LAB_00102c79:
        if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3b0,"Cannot open file ",0x11);
        sVar5 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0,__s,sVar5);
        local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"onehot","");
        sptk::PrintErrorMessage(&local_3e8,(ostringstream *)local_3b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
          operator_delete(local_3e8._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
        std::ios_base::~ios_base(local_340);
        iVar7 = 1;
      }
      std::ifstream::~ifstream(&local_238);
      return iVar7;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,"Cannot set translation mode",0x1b);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"onehot","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_238,"Too many input files",0x14);
    local_3b0[0]._M_dataplus._M_p = (pointer)&local_3b0[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"onehot","");
    sptk::PrintErrorMessage(local_3b0,(ostringstream *)&local_238);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0[0]._M_dataplus._M_p != &local_3b0[0].field_2) {
    operator_delete(local_3b0[0]._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
  std::ios_base::~ios_base(local_1c8);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("onehot", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("onehot", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("onehot", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("onehot", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  int index;
  std::vector<double> onehot_vector(vector_length, 0.0);

  for (int sample_index(0); sptk::ReadStream(&index, &input_stream);
       ++sample_index) {
    if (index < 0 || vector_length <= index) {
      std::ostringstream error_message;
      error_message << sample_index << "th sample is out of range";
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
    onehot_vector[index] = 1.0;
    if (!sptk::WriteStream(0, vector_length, onehot_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write one-hot vector";
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
    // cppcheck-suppress unreadVariable
    onehot_vector[index] = 0.0;
  }

  return 0;
}